

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedOneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  OneofDescriptor *pOVar1;
  LogMessage *other;
  Descriptor *this_00;
  Descriptor *d;
  FieldDescriptor *field_00;
  AlphaNum *in_R8;
  string local_138;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  undefined1 local_88 [8];
  string qualification;
  LogMessage local_50;
  cpp *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  pOVar1 = FieldDescriptor::containing_oneof((FieldDescriptor *)this);
  if (pOVar1 == (OneofDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1cf);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=
              ((LogFinisher *)(qualification.field_2._M_local_buf + 0xb),other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this_00 = FieldDescriptor::containing_type((FieldDescriptor *)local_18);
  QualifiedClassName_abi_cxx11_((string *)local_88,(cpp *)this_00,d);
  strings::AlphaNum::AlphaNum(&local_b8,(string *)local_88);
  strings::AlphaNum::AlphaNum(&local_e8,"::");
  OneofCaseConstantName_abi_cxx11_(&local_138,local_18,field_00);
  strings::AlphaNum::AlphaNum(&local_118,&local_138);
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_b8,&local_e8,&local_118,in_R8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedOneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  const std::string qualification =
      QualifiedClassName(field->containing_type());
  return StrCat(qualification, "::", OneofCaseConstantName(field));
}